

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

string * __thiscall
t_cpp_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *ttype,bool in_typedef,
          bool arg)

{
  _func_int **pp_Var1;
  long lVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  t_cpp_generator *ptVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string pname;
  string class_prefix;
  key_type local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d8;
  t_cpp_generator *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ptVar11 = this;
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar5 != '\0') {
    base_type_name_abi_cxx11_(&local_138,ptVar11,*(t_base *)&ttype[1].super_t_doc._vptr_t_doc);
    paVar14 = &local_158.field_2;
    local_158._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"cpp.type","");
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(ttype->annotations_)._M_t,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar14) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar6._M_node !=
        &(ttype->annotations_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&local_138);
    }
    if (arg) {
      if (*(int *)&ttype[1].super_t_doc._vptr_t_doc == 1) {
        std::operator+(&local_158,"const ",&local_138);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar9) {
          lVar2 = plVar7[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar14) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
      else {
        std::operator+(__return_storage_ptr__,"const ",&local_138);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                      local_138.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_138.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_138._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                      local_138.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_138._M_string_length;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0017d3f5;
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  if ((char)iVar5 == '\0') {
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    if ((in_typedef) &&
       ((iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype), (char)iVar5 != '\0' ||
        (iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar5 != '\0')))) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_138,0,(char *)local_138._M_string_length,0x399c84);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity =
         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ptVar11 = (t_cpp_generator *)ttype->program_;
    if ((ptVar11 == (t_cpp_generator *)0x0) ||
       (ptVar11 == (t_cpp_generator *)(this->super_t_oop_generator).super_t_generator.program_)) {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::operator+(&local_118,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar5));
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"cpp","");
      t_program::get_namespace(&local_70,(t_program *)ptVar11,&local_90);
      namespace_prefix(&local_d8,ptVar11,&local_70);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_d8,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_f8.field_2._M_allocated_capacity = *puVar10;
        local_f8.field_2._8_8_ = plVar7[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar10;
        local_f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f8._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_b8 = this;
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_f8,*(ulong *)CONCAT44(extraout_var_00,iVar5));
      psVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118.field_2._8_8_ = puVar8[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar9;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      this = local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    paVar14 = &local_158.field_2;
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if (((char)iVar5 != '\0') && (this->gen_pure_enums_ == false)) {
      std::__cxx11::string::append((char *)&local_158);
    }
    if (arg) {
      bVar4 = is_complex_type(this,ttype);
      if (bVar4) {
        std::operator+(&local_118,"const ",&local_158);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar9) {
          lVar2 = plVar7[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
      }
      else {
        std::operator+(__return_storage_ptr__,"const ",&local_158);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p == paVar14) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_158.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_158._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_158.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_158._M_string_length;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity =
           local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_158._M_dataplus._M_p = (pointer)paVar14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar14) goto LAB_0017d3e6;
  }
  else {
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
      pp_Var1 = ttype[1].super_t_doc._vptr_t_doc;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pp_Var1,
                 ttype[1].super_t_doc.doc_._M_dataplus._M_p + (long)pp_Var1);
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_158);
      _Var13._M_p = local_158._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0017d5ec:
        operator_delete(_Var13._M_p);
      }
    }
    else {
      iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
          if ((char)iVar5 == '\0') goto LAB_0017d5f1;
          type_name_abi_cxx11_
                    (&local_f8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
          std::operator+(&local_118,"std::vector<",&local_f8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
          puVar10 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_158.field_2._M_allocated_capacity = *puVar10;
            local_158.field_2._8_8_ = plVar7[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *puVar10;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)puVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_0017d5d9;
        }
        else {
          type_name_abi_cxx11_
                    (&local_f8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x383089);
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_118.field_2._M_allocated_capacity = *psVar9;
            local_118.field_2._8_8_ = puVar8[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar9;
            local_118._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_118._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          puVar10 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_158.field_2._M_allocated_capacity = *puVar10;
            local_158.field_2._8_8_ = puVar8[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *puVar10;
            local_158._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_158._M_string_length = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_0017d5d9:
            operator_delete(local_118._M_dataplus._M_p);
          }
        }
        psVar3 = &local_f8;
      }
      else {
        type_name_abi_cxx11_
                  (&local_50,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x38307f);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        paVar14 = &local_f8.field_2;
        puVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_f8.field_2._M_allocated_capacity = *puVar10;
          local_f8.field_2._8_8_ = puVar8[3];
          local_f8._M_dataplus._M_p = (pointer)paVar14;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar10;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        type_name_abi_cxx11_
                  (&local_b0,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,in_typedef,false);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar14) {
          uVar12 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_b0._M_string_length + local_f8._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            uVar12 = local_b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_b0._M_string_length + local_f8._M_string_length)
          goto LAB_0017d3a1;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b0,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
        }
        else {
LAB_0017d3a1:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_b0._M_dataplus._M_p);
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        psVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_118.field_2._M_allocated_capacity = *psVar9;
          local_118.field_2._8_8_ = puVar8[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar9;
          local_118._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_118._M_string_length = puVar8[1];
        *puVar8 = psVar9;
        puVar8[1] = 0;
        *(undefined1 *)psVar9 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
        puVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_158.field_2._M_allocated_capacity = *puVar10;
          local_158.field_2._8_8_ = puVar8[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *puVar10;
          local_158._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_158._M_string_length = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_138,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar14) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        psVar3 = &local_50;
      }
      _Var13._M_p = (pointer)(&(psVar3->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &psVar3->field_2) goto LAB_0017d5ec;
    }
LAB_0017d5f1:
    if (!arg) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                      local_138.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_138.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_138._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                      local_138.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_138._M_string_length;
      return __return_storage_ptr__;
    }
    std::operator+(&local_158,"const ",&local_138);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      lVar2 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0017d3e6:
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == &local_138.field_2) {
    return __return_storage_ptr__;
  }
LAB_0017d3f5:
  operator_delete(local_138._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_name(t_type* ttype, bool in_typedef, bool arg) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(((t_base_type*)ttype)->get_base());
    std::map<string, string>::iterator it = ttype->annotations_.find("cpp.type");
    if (it != ttype->annotations_.end()) {
      bname = it->second;
    }

    if (!arg) {
      return bname;
    }

    if (((t_base_type*)ttype)->get_base() == t_base_type::TYPE_STRING) {
      return "const " + bname + "&";
    } else {
      return "const " + bname;
    }
  }

  // Check for a custom overloaded C++ name
  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      cname = "std::map<" + type_name(tmap->get_key_type(), in_typedef) + ", "
              + type_name(tmap->get_val_type(), in_typedef) + "> ";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      cname = "std::set<" + type_name(tset->get_elem_type(), in_typedef) + "> ";
    } else if (ttype->is_list()) {
      t_list* tlist = (t_list*)ttype;
      cname = "std::vector<" + type_name(tlist->get_elem_type(), in_typedef) + "> ";
    }

    if (arg) {
      return "const " + cname + "&";
    } else {
      return cname;
    }
  }

  string class_prefix;
  if (in_typedef && (ttype->is_struct() || ttype->is_xception())) {
    class_prefix = "class ";
  }

  // Check if it needs to be namespaced
  string pname;
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    pname = class_prefix + namespace_prefix(program->get_namespace("cpp")) + ttype->get_name();
  } else {
    pname = class_prefix + ttype->get_name();
  }

  if (ttype->is_enum() && !gen_pure_enums_) {
    pname += "::type";
  }

  if (arg) {
    if (is_complex_type(ttype)) {
      return "const " + pname + "&";
    } else {
      return "const " + pname;
    }
  } else {
    return pname;
  }
}